

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-2.c
# Opt level: O2

int CheckBig(void)

{
  FILE *__stream;
  char *pcVar1;
  uint uVar2;
  int i;
  int iVar3;
  bool bVar4;
  int n;
  uint b;
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    iVar3 = -1;
    goto LAB_00102a36;
  }
  for (uVar2 = 0; uVar2 != 4; uVar2 = uVar2 + 1) {
    pcVar1 = ScanInt((FILE *)__stream,&n);
    if ((pcVar1 != "PASSED") || (n != 0)) {
      bVar4 = uVar2 < 4;
      printf("wrong output -- ");
      goto LAB_001029a7;
    }
  }
  bVar4 = false;
LAB_001029a7:
  for (iVar3 = 1; iVar3 != 5; iVar3 = iVar3 + 1) {
    pcVar1 = ScanInt((FILE *)__stream,&n);
    if ((pcVar1 != "PASSED") || (iVar3 != n)) goto LAB_00102a11;
  }
  if (bVar4) goto LAB_00102a1f;
  for (iVar3 = 1; iVar3 != 0x3fffffd; iVar3 = iVar3 + 4) {
    pcVar1 = ScanUintUint((FILE *)__stream,(uint *)&n,&b);
    if (((pcVar1 != "PASSED") || (iVar3 != n)) || (b != 8)) goto LAB_00102a11;
  }
  iVar3 = HaveGarbageAtTheEnd((FILE *)__stream);
  fclose(__stream);
  if (iVar3 == 0) {
    puts("PASSED");
    iVar3 = 0;
    goto LAB_00102a36;
  }
  goto LAB_00102a27;
LAB_00102a11:
  printf("wrong output -- ");
LAB_00102a1f:
  fclose(__stream);
LAB_00102a27:
  puts("FAILED");
  iVar3 = 1;
LAB_00102a36:
  testN = testN + 1;
  return iVar3;
}

Assistant:

static int CheckBig(void) {
    FILE *const out = fopen("out.txt", "r");
    int passed = 1;
    if (!out) {
        printf("can't open out.txt\n");
        ++testN;
        return -1;
    }

    for (int i = 0; i < 4; ++i) {
        int n;
        if (ScanInt(out, &n) != Pass || n != 0) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }

    for (int i = 1; i < 5; ++i) {
        int n;
        if (ScanInt(out, &n) != Pass || n != i) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }

    if (passed) {
        for (unsigned int i = 0; i < 1024 * 1024 * 8 * 2 - 1; ++i) {
            unsigned int a, b;
            if (ScanUintUint(out, &a, &b) != Pass || a != 1 + i * 4 || b != 8) {
                passed = 0;
                printf("wrong output -- ");
                break;
            }
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        ++testN;
        return 0;
    } else {
        printf("FAILED\n");
       ++testN;
        return 1;
    }
}